

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_crashes.cpp
# Opt level: O1

void __thiscall
CrashTest_PureVirtualMethodCallTest_Test::TestBody(CrashTest_PureVirtualMethodCallTest_Test *this)

{
  DeathTest *pDVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *message;
  DeathTest *gtest_dt;
  scoped_ptr<testing::internal::DeathTest> gtest_dt_ptr;
  DeathTest *local_f8;
  DeathTest *local_f0;
  AssertHelper local_e8 [4];
  Base local_c8;
  RE local_b8;
  
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_0010ac72;
  testing::internal::RE::Init(&local_b8,"");
  bVar3 = testing::internal::DeathTest::Create
                    ("Derived()",&local_b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
                     ,6,&local_f8);
  bVar2 = true;
  if (bVar3) {
    if (local_f8 != (DeathTest *)0x0) {
      local_f0 = local_f8;
      iVar5 = (*local_f8->_vptr_DeathTest[2])();
      pDVar1 = local_f8;
      if (iVar5 == 0) {
        iVar5 = (*local_f8->_vptr_DeathTest[3])(local_f8);
        bVar2 = testing::internal::ExitedUnsuccessfully(iVar5);
        iVar5 = (*local_f8->_vptr_DeathTest[4])(local_f8,(ulong)bVar2);
        if ((char)iVar5 != '\0') goto LAB_0010ac29;
        bVar2 = true;
        bVar3 = false;
      }
      else {
        if (iVar5 == 1) {
          bVar2 = testing::internal::AlwaysTrue();
          if (bVar2) {
            local_c8.m_pDerived = (Derived *)&local_c8;
            local_c8._vptr_Base = (_func_int **)&PTR_function_00144be8;
            Base::~Base((Base *)local_c8.m_pDerived);
          }
          (*local_f8->_vptr_DeathTest[5])(local_f8,2);
          (*pDVar1->_vptr_DeathTest[5])(pDVar1,0);
        }
LAB_0010ac29:
        bVar2 = false;
        bVar3 = true;
      }
      if (local_f0 != (DeathTest *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (local_f0 != (DeathTest *)0x0)) {
          (*local_f0->_vptr_DeathTest[1])();
        }
        local_f0 = (DeathTest *)0x0;
      }
      if (!bVar3) goto LAB_0010ac64;
    }
    bVar2 = false;
  }
LAB_0010ac64:
  testing::internal::RE::~RE(&local_b8);
  if (!bVar2) {
    return;
  }
LAB_0010ac72:
  testing::Message::Message((Message *)&local_b8);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (local_e8,kFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ribtoks[P]chillout/src/tests/tests_crashes.cpp"
             ,6,message);
  testing::internal::AssertHelper::operator=(local_e8,(Message *)&local_b8);
  testing::internal::AssertHelper::~AssertHelper(local_e8);
  if ((((long *)local_b8.pattern_ != (long *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     ((long *)local_b8.pattern_ != (long *)0x0)) {
    (**(code **)(*(long *)local_b8.pattern_ + 8))();
  }
  return;
}

Assistant:

TEST (CrashTest, PureVirtualMethodCallTest) {
    ASSERT_DEATH(Derived(), "");
}